

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O1

bool __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::IsBufferExecuteReadOnly
          (EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
           *this,TEmitBufferAllocation *allocation)

{
  SIZE_T SVar1;
  undefined1 local_50 [8];
  MEMORY_BASIC_INFORMATION memBasicInfo;
  
  CCLock::Enter(&(this->criticalSection).super_CCLock);
  SVar1 = VirtualQuery(allocation->allocation->address,(PMEMORY_BASIC_INFORMATION)local_50,0x30);
  CCLock::Leave(&(this->criticalSection).super_CCLock);
  return memBasicInfo.RegionSize._4_4_ == 0x20 && SVar1 != 0;
}

Assistant:

bool EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::IsBufferExecuteReadOnly(TEmitBufferAllocation * allocation)
{
    AutoRealOrFakeCriticalSection<SyncObject> autoCs(&this->criticalSection);
    MEMORY_BASIC_INFORMATION memBasicInfo;
    size_t resultBytes = VirtualQuery(allocation->allocation->address, &memBasicInfo, sizeof(memBasicInfo));
    return resultBytes != 0 && memBasicInfo.Protect == PAGE_EXECUTE_READ;
}